

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXConverter.cpp
# Opt level: O0

void __thiscall
Assimp::FBX::FBXConverter::ConvertWeights
          (FBXConverter *this,aiMesh *out,Model *model,MeshGeometry *geo,
          aiMatrix4x4 *node_global_transform,uint materialIndex,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *outputVertStartIndices)

{
  undefined1 auVar1 [16];
  size_t this_00;
  MatIndexArray *this_01;
  bool bVar2;
  uint uVar3;
  Skin *pSVar4;
  vector<const_Assimp::FBX::Cluster_*,_std::allocator<const_Assimp::FBX::Cluster_*>_> *pvVar5;
  size_type sVar6;
  reference ppCVar7;
  reference puVar8;
  const_reference pvVar9;
  reference pvVar10;
  iterator __first;
  ulong __n;
  aiBone **__s;
  iterator __first1;
  iterator __last1;
  bool bVar11;
  exception *anon_var_0;
  value_type_conflict7 local_150;
  uint *local_148;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_140;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_138;
  iterator it;
  uint local_124;
  value_type_conflict7 vStack_120;
  uint i;
  uint *local_118;
  uint *out_idx;
  uint count;
  value_type_conflict1 index;
  const_iterator __end3;
  const_iterator __begin3;
  WeightIndexArray *__range3;
  size_t no_index_sentinel;
  MatIndexArray *mats;
  WeightIndexArray *indices;
  Cluster *cluster;
  const_iterator __end2;
  const_iterator __begin2;
  vector<const_Assimp::FBX::Cluster_*,_std::allocator<const_Assimp::FBX::Cluster_*>_> *__range2;
  undefined1 local_b0 [7];
  bool no_mat_check;
  vector<aiBone_*,_std::allocator<aiBone_*>_> bones;
  Skin *sk;
  vector<unsigned_long,_std::allocator<unsigned_long>_> count_out_indices;
  vector<unsigned_long,_std::allocator<unsigned_long>_> index_out_indices;
  vector<unsigned_long,_std::allocator<unsigned_long>_> out_indices;
  uint materialIndex_local;
  aiMatrix4x4 *node_global_transform_local;
  MeshGeometry *geo_local;
  Model *model_local;
  aiMesh *out_local;
  FBXConverter *this_local;
  
  pSVar4 = Geometry::DeformerSkin(&geo->super_Geometry);
  if (pSVar4 == (Skin *)0x0) {
    __assert_fail("geo.DeformerSkin()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/code/FBX/FBXConverter.cpp"
                  ,0x5b1,
                  "void Assimp::FBX::FBXConverter::ConvertWeights(aiMesh *, const Model &, const MeshGeometry &, const aiMatrix4x4 &, unsigned int, std::vector<unsigned int> *)"
                 );
  }
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
             &index_out_indices.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
             &count_out_indices.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&sk);
  pSVar4 = Geometry::DeformerSkin(&geo->super_Geometry);
  std::vector<aiBone_*,_std::allocator<aiBone_*>_>::vector
            ((vector<aiBone_*,_std::allocator<aiBone_*>_> *)local_b0);
  pvVar5 = Skin::Clusters(pSVar4);
  sVar6 = std::vector<const_Assimp::FBX::Cluster_*,_std::allocator<const_Assimp::FBX::Cluster_*>_>::
          size(pvVar5);
  std::vector<aiBone_*,_std::allocator<aiBone_*>_>::reserve
            ((vector<aiBone_*,_std::allocator<aiBone_*>_> *)local_b0,sVar6);
  bVar11 = materialIndex == 0xffffffff;
  if (!bVar11 &&
      outputVertStartIndices == (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
    __assert_fail("no_mat_check || outputVertStartIndices",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/code/FBX/FBXConverter.cpp"
                  ,0x5bd,
                  "void Assimp::FBX::FBXConverter::ConvertWeights(aiMesh *, const Model &, const MeshGeometry &, const aiMatrix4x4 &, unsigned int, std::vector<unsigned int> *)"
                 );
  }
  pvVar5 = Skin::Clusters(pSVar4);
  __end2 = std::vector<const_Assimp::FBX::Cluster_*,_std::allocator<const_Assimp::FBX::Cluster_*>_>
           ::begin(pvVar5);
  cluster = (Cluster *)
            std::vector<const_Assimp::FBX::Cluster_*,_std::allocator<const_Assimp::FBX::Cluster_*>_>
            ::end(pvVar5);
  do {
    bVar2 = __gnu_cxx::operator!=
                      (&__end2,(__normal_iterator<const_Assimp::FBX::Cluster_*const_*,_std::vector<const_Assimp::FBX::Cluster_*,_std::allocator<const_Assimp::FBX::Cluster_*>_>_>
                                *)&cluster);
    if (!bVar2) {
      bVar11 = std::vector<aiBone_*,_std::allocator<aiBone_*>_>::empty
                         ((vector<aiBone_*,_std::allocator<aiBone_*>_> *)local_b0);
      if (!bVar11) {
        sVar6 = std::vector<aiBone_*,_std::allocator<aiBone_*>_>::size
                          ((vector<aiBone_*,_std::allocator<aiBone_*>_> *)local_b0);
        auVar1._8_8_ = 0;
        auVar1._0_8_ = sVar6;
        __n = SUB168(auVar1 * ZEXT816(8),0);
        if (SUB168(auVar1 * ZEXT816(8),8) != 0) {
          __n = 0xffffffffffffffff;
        }
        __s = (aiBone **)operator_new__(__n);
        memset(__s,0,__n);
        out->mBones = __s;
        sVar6 = std::vector<aiBone_*,_std::allocator<aiBone_*>_>::size
                          ((vector<aiBone_*,_std::allocator<aiBone_*>_> *)local_b0);
        out->mNumBones = (uint)sVar6;
        __first1 = std::vector<aiBone_*,_std::allocator<aiBone_*>_>::begin
                             ((vector<aiBone_*,_std::allocator<aiBone_*>_> *)local_b0);
        __last1 = std::vector<aiBone_*,_std::allocator<aiBone_*>_>::end
                            ((vector<aiBone_*,_std::allocator<aiBone_*>_> *)local_b0);
        std::
        swap_ranges<__gnu_cxx::__normal_iterator<aiBone**,std::vector<aiBone*,std::allocator<aiBone*>>>,aiBone**>
                  ((__normal_iterator<aiBone_**,_std::vector<aiBone_*,_std::allocator<aiBone_*>_>_>)
                   __first1._M_current,
                   (__normal_iterator<aiBone_**,_std::vector<aiBone_*,_std::allocator<aiBone_*>_>_>)
                   __last1._M_current,out->mBones);
      }
      std::vector<aiBone_*,_std::allocator<aiBone_*>_>::~vector
                ((vector<aiBone_*,_std::allocator<aiBone_*>_> *)local_b0);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&sk);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                 &count_out_indices.
                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                 &index_out_indices.
                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage);
      return;
    }
    ppCVar7 = __gnu_cxx::
              __normal_iterator<const_Assimp::FBX::Cluster_*const_*,_std::vector<const_Assimp::FBX::Cluster_*,_std::allocator<const_Assimp::FBX::Cluster_*>_>_>
              ::operator*(&__end2);
    indices = (WeightIndexArray *)*ppCVar7;
    if ((Cluster *)indices == (Cluster *)0x0) {
      __assert_fail("cluster",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/code/FBX/FBXConverter.cpp"
                    ,0x5c2,
                    "void Assimp::FBX::FBXConverter::ConvertWeights(aiMesh *, const Model &, const MeshGeometry &, const aiMatrix4x4 &, unsigned int, std::vector<unsigned int> *)"
                   );
    }
    mats = (MatIndexArray *)Cluster::GetIndices((Cluster *)indices);
    no_index_sentinel = (size_t)MeshGeometry::GetMaterialIndices(geo);
    __range3 = (WeightIndexArray *)0xffffffffffffffff;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::clear
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&sk);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::clear
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
               &count_out_indices.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::clear
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
               &index_out_indices.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage);
    this_01 = mats;
    __end3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin
                       ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)mats);
    _count = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end
                       ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)this_01);
    while (bVar2 = __gnu_cxx::operator!=
                             (&__end3,(__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                                       *)&count), bVar2) {
      puVar8 = __gnu_cxx::
               __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
               ::operator*(&__end3);
      out_idx._4_4_ = *puVar8;
      out_idx._0_4_ = 0;
      local_118 = MeshGeometry::ToOutputVertexIndex(geo,out_idx._4_4_,(uint *)&out_idx);
      if (local_118 == (uint *)0x0) {
        __assert_fail("out_idx != __null",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/code/FBX/FBXConverter.cpp"
                      ,0x5d6,
                      "void Assimp::FBX::FBXConverter::ConvertWeights(aiMesh *, const Model &, const MeshGeometry &, const aiMatrix4x4 &, unsigned int, std::vector<unsigned int> *)"
                     );
      }
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                 &count_out_indices.
                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage,(value_type_conflict7 *)&__range3);
      vStack_120 = 0;
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&sk,
                 &stack0xfffffffffffffee0);
      for (local_124 = 0; this_00 = no_index_sentinel, local_124 < (uint)out_idx;
          local_124 = local_124 + 1) {
        if (bVar11) {
LAB_009ac7df:
          pvVar10 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::back
                              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                               &count_out_indices.
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage);
          if (*pvVar10 == 0xffffffffffffffff) {
            sVar6 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                               &index_out_indices.
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage);
            pvVar10 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::back
                                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                                 &count_out_indices.
                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage);
            *pvVar10 = sVar6;
          }
          if (bVar11) {
            it._M_current = (uint *)(ulong)local_118[local_124];
            std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                      ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                       &index_out_indices.
                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage,(value_type_conflict7 *)&it);
          }
          else {
            local_140._M_current =
                 (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin
                                   (outputVertStartIndices);
            local_148 = (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end
                                          (outputVertStartIndices);
            local_138 = std::
                        lower_bound<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,unsigned_int>
                                  (local_140,
                                   (__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                                    )local_148,local_118 + local_124);
            __first = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin
                                (outputVertStartIndices);
            local_150 = std::
                        distance<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>>
                                  ((__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                                    )__first._M_current,local_138);
            std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                      ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                       &index_out_indices.
                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage,&local_150);
          }
          pvVar10 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::back
                              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&sk);
          *pvVar10 = *pvVar10 + 1;
        }
        else {
          uVar3 = MeshGeometry::FaceForVertexIndex(geo,local_118[local_124]);
          pvVar9 = std::vector<int,_std::allocator<int>_>::operator[]
                             ((vector<int,_std::allocator<int>_> *)this_00,(ulong)uVar3);
          if ((long)*pvVar9 == (ulong)materialIndex) goto LAB_009ac7df;
        }
      }
      __gnu_cxx::
      __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
      ::operator++(&__end3);
    }
    ConvertCluster(this,(vector<aiBone_*,_std::allocator<aiBone_*>_> *)local_b0,model,
                   (Cluster *)indices,
                   (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                   &index_out_indices.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage,
                   (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                   &count_out_indices.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage,
                   (vector<unsigned_long,_std::allocator<unsigned_long>_> *)&sk,
                   node_global_transform);
    __gnu_cxx::
    __normal_iterator<const_Assimp::FBX::Cluster_*const_*,_std::vector<const_Assimp::FBX::Cluster_*,_std::allocator<const_Assimp::FBX::Cluster_*>_>_>
    ::operator++(&__end2);
  } while( true );
}

Assistant:

void FBXConverter::ConvertWeights(aiMesh* out, const Model& model, const MeshGeometry& geo,
            const aiMatrix4x4& node_global_transform,
            unsigned int materialIndex,
            std::vector<unsigned int>* outputVertStartIndices)
        {
            ai_assert(geo.DeformerSkin());

            std::vector<size_t> out_indices;
            std::vector<size_t> index_out_indices;
            std::vector<size_t> count_out_indices;

            const Skin& sk = *geo.DeformerSkin();

            std::vector<aiBone*> bones;
            bones.reserve(sk.Clusters().size());

            const bool no_mat_check = materialIndex == NO_MATERIAL_SEPARATION;
            ai_assert(no_mat_check || outputVertStartIndices);

            try {

                for (const Cluster* cluster : sk.Clusters()) {
                    ai_assert(cluster);

                    const WeightIndexArray& indices = cluster->GetIndices();

                    const MatIndexArray& mats = geo.GetMaterialIndices();

                    const size_t no_index_sentinel = std::numeric_limits<size_t>::max();

                    count_out_indices.clear();
                    index_out_indices.clear();
                    out_indices.clear();

                    // now check if *any* of these weights is contained in the output mesh,
                    // taking notes so we don't need to do it twice.
                    for (WeightIndexArray::value_type index : indices) {

                        unsigned int count = 0;
                        const unsigned int* const out_idx = geo.ToOutputVertexIndex(index, count);
                        // ToOutputVertexIndex only returns NULL if index is out of bounds
                        // which should never happen
                        ai_assert(out_idx != NULL);

                        index_out_indices.push_back(no_index_sentinel);
                        count_out_indices.push_back(0);

                        for (unsigned int i = 0; i < count; ++i) {
                            if (no_mat_check || static_cast<size_t>(mats[geo.FaceForVertexIndex(out_idx[i])]) == materialIndex) {

                                if (index_out_indices.back() == no_index_sentinel) {
                                    index_out_indices.back() = out_indices.size();
                                }

                                if (no_mat_check) {
                                    out_indices.push_back(out_idx[i]);
                                } else {
                                    // this extra lookup is in O(logn), so the entire algorithm becomes O(nlogn)
                                    const std::vector<unsigned int>::iterator it = std::lower_bound(
                                        outputVertStartIndices->begin(),
                                        outputVertStartIndices->end(),
                                        out_idx[i]
                                    );

                                    out_indices.push_back(std::distance(outputVertStartIndices->begin(), it));
                                }

                                ++count_out_indices.back();                               
                            }
                        }
                    }
                    
                    // if we found at least one, generate the output bones
                    // XXX this could be heavily simplified by collecting the bone
                    // data in a single step.
                    ConvertCluster(bones, model, *cluster, out_indices, index_out_indices,
                            count_out_indices, node_global_transform);
                }
            }
            catch (std::exception&) {
                std::for_each(bones.begin(), bones.end(), Util::delete_fun<aiBone>());
                throw;
            }

            if (bones.empty()) {
                return;
            }

            out->mBones = new aiBone*[bones.size()]();
            out->mNumBones = static_cast<unsigned int>(bones.size());

            std::swap_ranges(bones.begin(), bones.end(), out->mBones);
        }